

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::setSuspended(QFutureInterfaceBase *this,bool suspend)

{
  QAtomicInt *pQVar1;
  QFutureInterfaceBasePrivate *pQVar2;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QFutureCallOutEvent local_60;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&this->d->m_mutex);
  if ((int)CONCAT71(in_register_00000031,suspend) == 0) {
    LOCK();
    pQVar1 = &this->d->state;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i & 0xffffffcf;
    UNLOCK();
    QWaitCondition::wakeAll(&this->d->pausedWaitCondition);
    pQVar2 = this->d;
    QFutureCallOutEvent::QFutureCallOutEvent(&local_60,Resumed,-1);
    QFutureInterfaceBasePrivate::sendCallOut(pQVar2,&local_60);
  }
  else {
    LOCK();
    pQVar1 = &this->d->state;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i | 0x10;
    UNLOCK();
    pQVar2 = this->d;
    QFutureCallOutEvent::QFutureCallOutEvent(&local_60,Suspending,-1);
    QFutureInterfaceBasePrivate::sendCallOut(pQVar2,&local_60);
  }
  QFutureCallOutEvent::~QFutureCallOutEvent(&local_60);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setSuspended(bool suspend)
{
    QMutexLocker locker(&d->m_mutex);
    if (suspend) {
        switch_on(d->state, Suspending);
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Suspending));
    } else {
        switch_off(d->state, suspendingOrSuspended);
        d->pausedWaitCondition.wakeAll();
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Resumed));
    }
}